

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O2

QLoggingCategory * lcDD(void)

{
  QLoggingCategory *pQVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  undefined8 uVar3;
  
  iVar2 = CONCAT31((int3)((uint)in_EAX >> 8),lcDD()::category);
  if (lcDD()::category == '\0') {
    uVar3 = __cxa_guard_acquire(&lcDD()::category);
    in_register_00000004 = (undefined4)((ulong)uVar3 >> 0x20);
    iVar2 = (int)uVar3;
    if (iVar2 != 0) {
      QLoggingCategory::QLoggingCategory(&lcDD::category,"qt.qpa.input",QtDebugMsg);
      __cxa_atexit(QLoggingCategory::~QLoggingCategory,&lcDD::category,&__dso_handle);
      pQVar1 = (QLoggingCategory *)__cxa_guard_release(&lcDD()::category);
      return pQVar1;
    }
  }
  return (QLoggingCategory *)CONCAT44(in_register_00000004,iVar2);
}

Assistant:

QDeviceDiscovery *QDeviceDiscovery::create(QDeviceTypes types, QObject *parent)
{
    qCDebug(lcDD) << "udev device discovery for type" << types;

    QDeviceDiscovery *helper = nullptr;
    struct udev *udev;

    udev = udev_new();
    if (udev) {
        helper = new QDeviceDiscoveryUDev(types, udev, parent);
    } else {
        qWarning("Failed to get udev library context");
    }

    return helper;
}